

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O2

bool __thiscall
wallet::WalletBatch::WriteKeyMetadata
          (WalletBatch *this,CKeyMetadata *meta,CPubKey *pubkey,bool overwrite)

{
  bool bVar1;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CPubKey>
  pStack_98;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string
            ((string *)&pStack_98,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             DBKeys::KEYMETA_abi_cxx11_);
  memcpy(&pStack_98.second,pubkey,0x41);
  bVar1 = WriteIC<std::pair<std::__cxx11::string,CPubKey>,wallet::CKeyMetadata>
                    (this,&pStack_98,meta,overwrite);
  std::__cxx11::string::~string((string *)&pStack_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteKeyMetadata(const CKeyMetadata& meta, const CPubKey& pubkey, const bool overwrite)
{
    return WriteIC(std::make_pair(DBKeys::KEYMETA, pubkey), meta, overwrite);
}